

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinfo.c
# Opt level: O3

char * getkeyname(char *cp,size_t len,int k)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  
  uVar2 = (ulong)(uint)k & 0xff;
  if (-1 < k) {
    uVar2 = (ulong)(uint)k;
  }
  uVar3 = (uint)uVar2;
  if ((int)uVar3 < 0x1b) {
    if (uVar3 == 0) {
      pcVar4 = "C-SPC";
LAB_00109e52:
      uVar1 = strlcpy(cp,pcVar4,len);
      uVar2 = len - 1;
      if (uVar1 < len) {
        uVar2 = uVar1;
      }
      return cp + uVar2;
    }
    if (uVar3 == 9) {
      pcVar4 = "TAB";
      goto LAB_00109e52;
    }
    if (uVar3 == 0xd) {
      pcVar4 = "RET";
      goto LAB_00109e52;
    }
  }
  else if ((int)uVar3 < 0x7f) {
    if (uVar3 == 0x1b) {
      pcVar4 = "ESC";
      goto LAB_00109e52;
    }
    if (uVar3 == 0x20) {
      pcVar4 = "SPC";
      goto LAB_00109e52;
    }
  }
  else {
    if (uVar3 == 0x7f) {
      pcVar4 = "DEL";
      goto LAB_00109e52;
    }
    if (uVar3 == 0x100) {
      pcVar4 = keystrings[0];
      if (keystrings[0] != (char *)0x0) goto LAB_00109e52;
      goto LAB_00109e0b;
    }
  }
  if (uVar3 < 0x80) {
    uVar1 = uVar2;
    if (uVar3 < 0x20) {
      cp[0] = 'C';
      cp[1] = '-';
      cp = cp + 2;
      uVar1 = (ulong)(uVar3 | 0x60);
      if ((cinfo[uVar2 + 0x40] & 2U) == 0) {
        uVar1 = uVar2 | 0x40;
      }
    }
    *cp = (char)uVar1;
    cp[1] = '\0';
    return cp + 1;
  }
LAB_00109e0b:
  *cp = '0';
  cp[1] = (byte)(uVar2 >> 6) & 7 | 0x30;
  cp[2] = (byte)(uVar2 >> 3) & 7 | 0x30;
  cp[3] = (byte)uVar2 & 7 | 0x30;
  cp[4] = '\0';
  return cp + 4;
}

Assistant:

char *
getkeyname(char *cp, size_t len, int k)
{
	const char	*np;
	size_t		 copied;

	if (k < 0)
		k = CHARMASK(k);	/* sign extended char */
	switch (k) {
	case CCHR('@'):
		np = "C-SPC";
		break;
	case CCHR('I'):
		np = "TAB";
		break;
	case CCHR('M'):
		np = "RET";
		break;
	case CCHR('['):
		np = "ESC";
		break;
	case ' ':
		np = "SPC";
		break;		/* yuck again */
	case CCHR('?'):
		np = "DEL";
		break;
	default:
		if (k >= KFIRST && k <= KLAST &&
		    (np = keystrings[k - KFIRST]) != NULL)
			break;
		if (k > CCHR('?')) {
			*cp++ = '0';
			*cp++ = ((k >> 6) & 7) + '0';
			*cp++ = ((k >> 3) & 7) + '0';
			*cp++ = (k & 7) + '0';
			*cp = '\0';
			return (cp);
		} else if (k < ' ') {
			*cp++ = 'C';
			*cp++ = '-';
			k = CCHR(k);
			if (ISUPPER(k))
				k = TOLOWER(k);
		}
		*cp++ = k;
		*cp = '\0';
		return (cp);
	}
	copied = strlcpy(cp, np, len);
	if (copied >= len)
		copied = len - 1;
	return (cp + copied);
}